

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.cpp
# Opt level: O0

void __thiscall
HighsPseudocostInitialization::HighsPseudocostInitialization
          (HighsPseudocostInitialization *this,HighsPseudocost *pscost,HighsInt maxCount)

{
  double dVar1;
  long *plVar2;
  size_type sVar3;
  reference pvVar4;
  int *piVar5;
  const_reference pvVar6;
  reference pvVar7;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar8;
  HighsInt i;
  HighsInt ncol;
  allocator_type *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  int iVar9;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffef0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff20;
  pointer *ppdVar10;
  int local_48 [4];
  long local_38 [4];
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff18);
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(local_10 + 0xf0));
  std::allocator<double>::allocator((allocator<double> *)0x6886ca);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,in_stack_fffffffffffffee0);
  std::allocator<double>::~allocator((allocator<double> *)0x6886f6);
  std::vector<double,_std::allocator<double>_>::size
            ((vector<double,_std::allocator<double>_> *)(local_10 + 0xf0));
  std::allocator<double>::allocator((allocator<double> *)0x68873a);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffef0,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
             ,in_stack_fffffffffffffee0);
  std::allocator<double>::~allocator((allocator<double> *)0x688763);
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = *(pointer *)(local_10 + 0x130);
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = *(pointer *)(local_10 + 0x138);
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)(local_10 + 0x128);
  local_38[1] = 1;
  plVar2 = std::min<long>(local_38 + 1,(long *)(local_10 + 0x140));
  in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)*plVar2;
  ppdVar10 = &in_RDI[0xb].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_38[0] = 1;
  plVar2 = std::min<long>(local_38,(long *)(local_10 + 0x148));
  *ppdVar10 = (pointer)*plVar2;
  sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RDI);
  local_48[3] = (int)sVar3;
  in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)((double)in_RDI[10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage /
                ((double)local_48[3] * *(double *)(local_10 + 0x120)));
  for (local_48[2] = 0; local_48[2] != local_48[3]; local_48[2] = local_48[2] + 1) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_48[2]);
    piVar5 = std::min<int>(pvVar4,&local_14);
    iVar9 = *piVar5;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)local_48[2]);
    *pvVar4 = iVar9;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_48[2]);
    piVar5 = std::min<int>(pvVar4,&local_14);
    iVar9 = *piVar5;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 3),(long)local_48[2]);
    *pvVar4 = iVar9;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_48[2]);
    local_48[1] = 1;
    piVar5 = std::min<int>(pvVar4,local_48 + 1);
    iVar9 = *piVar5;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 6),(long)local_48[2]);
    *pvVar4 = iVar9;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)local_48[2]);
    local_48[0] = 1;
    piVar5 = std::min<int>(pvVar4,local_48);
    iVar9 = *piVar5;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 7),(long)local_48[2]);
    *pvVar4 = iVar9;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0xf0),
                        (long)local_48[2]);
    dVar8 = *pvVar6;
    dVar1 = *(double *)(local_10 + 0x120);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 8,(long)local_48[2]);
    *pvVar7 = dVar8 / dVar1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_10 + 0x108),
                        (long)local_48[2]);
    dVar8 = *pvVar6 / *(double *)(local_10 + 0x120);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI + 9,(long)local_48[2]);
    *pvVar7 = dVar8;
  }
  return;
}

Assistant:

HighsPseudocostInitialization::HighsPseudocostInitialization(
    const HighsPseudocost& pscost, HighsInt maxCount)
    : pseudocostup(pscost.pseudocostup),
      pseudocostdown(pscost.pseudocostdown),
      nsamplesup(pscost.nsamplesup),
      nsamplesdown(pscost.nsamplesdown),
      inferencesup(pscost.inferencesup),
      inferencesdown(pscost.inferencesdown),
      ninferencesup(pscost.ninferencesup),
      ninferencesdown(pscost.ninferencesdown),
      conflictscoreup(pscost.conflictscoreup.size()),
      conflictscoredown(pscost.conflictscoreup.size()),
      cost_total(pscost.cost_total),
      inferences_total(pscost.inferences_total),
      conflict_avg_score(pscost.conflict_avg_score),
      nsamplestotal(std::min(int64_t{1}, pscost.nsamplestotal)),
      ninferencestotal(std::min(int64_t{1}, pscost.ninferencestotal)) {
  HighsInt ncol = pseudocostup.size();
  conflict_avg_score /= ncol * pscost.conflict_weight;
  for (HighsInt i = 0; i != ncol; ++i) {
    nsamplesup[i] = std::min(nsamplesup[i], maxCount);
    nsamplesdown[i] = std::min(nsamplesdown[i], maxCount);
    ninferencesup[i] = std::min(ninferencesup[i], HighsInt{1});
    ninferencesdown[i] = std::min(ninferencesdown[i], HighsInt{1});
    conflictscoreup[i] = pscost.conflictscoreup[i] / pscost.conflict_weight;
    conflictscoredown[i] = pscost.conflictscoredown[i] / pscost.conflict_weight;
  }
}